

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadOptions.cpp
# Opt level: O1

HighsLoadOptionsStatus
loadOptionsFromFile(HighsLogOptions *report_log_options,HighsOptions *options,string *filename)

{
  _func_int *p_Var1;
  char cVar2;
  OptionStatus OVar3;
  long lVar4;
  uint uVar5;
  HighsLoadOptionsStatus HVar6;
  string line;
  string value;
  string option;
  string non_chars;
  ifstream file;
  HighsLogOptions *local_308;
  char *local_300;
  ulong local_2f8;
  char local_2f0 [16];
  string local_2e0;
  string local_2c0;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *local_2a0;
  string local_298;
  string local_278;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 local_238 [520];
  
  if (filename->_M_string_length == 0) {
    HVar6 = kEmpty;
  }
  else {
    local_300 = local_2f0;
    local_2f8 = 0;
    local_2f0[0] = '\0';
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    local_2c0._M_string_length = 0;
    local_2c0.field_2._M_local_buf[0] = '\0';
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    local_2e0._M_string_length = 0;
    local_2e0.field_2._M_local_buf[0] = '\0';
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"\t\n\v\f\r\"\' ","");
    std::ifstream::ifstream(local_238,(string *)filename,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      HVar6 = kError;
      highsLogUser(report_log_options,kError,"Options file not found\n");
    }
    else {
      p_Var1 = *(_func_int **)(local_238._0_8_ + -0x18);
      if (*(int *)(p_Var1 + (long)(local_238 + 0x20)) == 0) {
        local_2a0 = &options->records;
        uVar5 = 1;
        local_308 = report_log_options;
        do {
          cVar2 = std::ios::widen((char)(_func_int *)((long)&local_308 + (long)p_Var1) + -0x30);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_300,cVar2);
          if ((local_2f8 != 0) && (*local_300 != '#')) {
            lVar4 = std::__cxx11::string::find_first_of((char *)&local_300,0x3c6253,0);
            if ((lVar4 == -1) || (local_2f8 <= lVar4 + 1U)) {
              HVar6 = kError;
              highsLogUser(local_308,kError,"Error on line %d of options file.\n",(ulong)uVar5);
              goto LAB_002037e8;
            }
            std::__cxx11::string::substr((ulong)local_258,(ulong)&local_300);
            std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_258);
            if (local_258[0] != local_248) {
              operator_delete(local_258[0]);
            }
            std::__cxx11::string::substr((ulong)local_258,(ulong)&local_300);
            std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_258);
            if (local_258[0] != local_248) {
              operator_delete(local_258[0]);
            }
            trim(&local_2c0,&local_278);
            trim(&local_2e0,&local_278);
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            OVar3 = setLocalOptionValue(local_308,&local_2c0,
                                        &(options->super_HighsOptionsStruct).log_options,local_2a0,
                                        &local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            if (OVar3 != kOk) {
              HVar6 = kError;
              highsLogUser(local_308,kError,"Cannot read value \"%s\" for option \"%s\"\n",
                           local_2e0._M_dataplus._M_p,local_2c0._M_dataplus._M_p);
              goto LAB_002037e8;
            }
          }
          p_Var1 = *(_func_int **)(local_238._0_8_ + -0x18);
          uVar5 = uVar5 + 1;
        } while (*(int *)(p_Var1 + (long)(local_238 + 0x20)) == 0);
        HVar6 = kOk;
      }
      else {
        HVar6 = kOk;
      }
    }
LAB_002037e8:
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (local_300 != local_2f0) {
      operator_delete(local_300);
    }
  }
  return HVar6;
}

Assistant:

HighsLoadOptionsStatus loadOptionsFromFile(
    const HighsLogOptions& report_log_options, HighsOptions& options,
    const std::string filename) {
  if (filename.size() == 0) return HighsLoadOptionsStatus::kEmpty;

  string line, option, value;
  HighsInt line_count = 0;
  // loadOptionsFromFile needs its own non-chars string since the
  // default setting in io/stringutil.h excludes \" and \' that can
  // appear in an MPS name - the only other place where trim() is used
  const std::string non_chars = "\t\n\v\f\r\"\' ";
  std::ifstream file(filename);
  if (file.is_open()) {
    while (file.good()) {
      getline(file, line);
      line_count++;
      if (line.size() == 0 || line[0] == '#') continue;

      size_t equals = line.find_first_of("=");
      if (equals == std::string::npos || equals + 1 >= line.size()) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "Error on line %" HIGHSINT_FORMAT " of options file.\n",
                     line_count);
        return HighsLoadOptionsStatus::kError;
      }
      option = line.substr(0, equals);
      value = line.substr(equals + 1, line.size() - equals);
      trim(option, non_chars);
      trim(value, non_chars);
      if (setLocalOptionValue(report_log_options, option, options.log_options,
                              options.records, value) != OptionStatus::kOk) {
        highsLogUser(report_log_options, HighsLogType::kError,
                     "Cannot read value \"%s\" for option \"%s\"\n",
                     value.c_str(), option.c_str());
        return HighsLoadOptionsStatus::kError;
      }
    }
  } else {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "Options file not found\n");
    return HighsLoadOptionsStatus::kError;
  }

  return HighsLoadOptionsStatus::kOk;
}